

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mux.c
# Opt level: O0

void envy_bios_print_mux(envy_bios *bios,FILE *out,uint mask)

{
  envy_bios_mux *peVar1;
  envy_bios_mux_entry *peVar2;
  char *pcVar3;
  char *subs [4];
  int local_3c;
  int j;
  envy_bios_mux_entry *entry;
  int i;
  envy_bios_mux *mux;
  uint mask_local;
  FILE *out_local;
  envy_bios *bios_local;
  
  peVar1 = &bios->mux;
  if ((peVar1->offset != 0) && ((mask & 0x200000) != 0)) {
    if ((bios->mux).valid == '\0') {
      fprintf((FILE *)out,"Failed to parse MUX table at 0x%04x version %d.%d\n\n",
              (ulong)peVar1->offset,(ulong)(uint)((int)(uint)(bios->mux).version >> 4),
              (ulong)((bios->mux).version & 0xf));
    }
    else {
      fprintf((FILE *)out,"MUX table at 0x%04x version %d.%d\n",(ulong)peVar1->offset,
              (ulong)(uint)((int)(uint)(bios->mux).version >> 4),(ulong)((bios->mux).version & 0xf))
      ;
      envy_bios_dump_hex(bios,out,(uint)peVar1->offset,(uint)(bios->mux).hlen,mask);
      for (entry._4_4_ = 0; (int)entry._4_4_ < (int)(uint)(bios->mux).entriesnum;
          entry._4_4_ = entry._4_4_ + 1) {
        peVar2 = (bios->mux).entries + (int)entry._4_4_;
        if ((peVar2->idx != '\x1f') || ((mask & 0x40000000) != 0)) {
          fprintf((FILE *)out,"MUX %d:",(ulong)entry._4_4_);
          if (peVar2->idx == '\x1f') {
            fprintf((FILE *)out," UNUSED");
          }
          else {
            fprintf((FILE *)out," DCB %d",(ulong)peVar2->idx);
          }
          for (local_3c = 0; local_3c < 4; local_3c = local_3c + 1) {
            if (peVar2->sub_line[local_3c] != '\x1f') {
              subs[0] = "UNK1";
              subs[1] = "HPD";
              subs[2] = "DDC";
              pcVar3 = "GPIO";
              if (peVar2->sub_loc[local_3c] != '\0') {
                pcVar3 = "XPIO";
              }
              fprintf((FILE *)out," %s: %s line %d val %d",subs[(long)local_3c + -1],pcVar3,
                      (ulong)peVar2->sub_line[local_3c],(ulong)peVar2->sub_val[local_3c]);
              if (peVar2->sub_unk7[local_3c] != '\0') {
                fprintf((FILE *)out," unk7 %d",(ulong)peVar2->sub_unk7[local_3c]);
              }
            }
          }
          fprintf((FILE *)out,"\n");
        }
        envy_bios_dump_hex(bios,out,(uint)peVar2->offset,(uint)(bios->mux).rlen,mask);
      }
      fprintf((FILE *)out,"\n");
    }
  }
  return;
}

Assistant:

void envy_bios_print_mux (struct envy_bios *bios, FILE *out, unsigned mask) {
	struct envy_bios_mux *mux = &bios->mux;
	if (!mux->offset || !(mask & ENVY_BIOS_PRINT_MUX))
		return;
	if (!mux->valid) {
		fprintf(out, "Failed to parse MUX table at 0x%04x version %d.%d\n\n", mux->offset, mux->version >> 4, mux->version & 0xf);
		return;
	}
	fprintf(out, "MUX table at 0x%04x version %d.%d\n", mux->offset, mux->version >> 4, mux->version & 0xf);
	envy_bios_dump_hex(bios, out, mux->offset, mux->hlen, mask);
	int i;
	for (i = 0; i < mux->entriesnum; i++) {
		struct envy_bios_mux_entry *entry = &mux->entries[i];
		if (entry->idx != 0x1f || mask & ENVY_BIOS_PRINT_UNUSED) {
			fprintf(out, "MUX %d:", i);
			if (entry->idx != 0x1f)
				fprintf(out, " DCB %d", entry->idx);
			else
				fprintf(out, " UNUSED");
			int j;
			for (j = 0; j < 4; j++) {
				if (entry->sub_line[j] != 0x1f) {
					const char *const subs[4] = {
						"OUT",
						"UNK1",
						"HPD",
						"DDC",
					};
					fprintf(out, " %s: %s line %d val %d", subs[j], entry->sub_loc[j]?"XPIO":"GPIO", entry->sub_line[j], entry->sub_val[j]);
					if (entry->sub_unk7[j])
						fprintf(out, " unk7 %d", entry->sub_unk7[j]);
				}
			}
			fprintf(out, "\n");
		}
		envy_bios_dump_hex(bios, out, entry->offset, mux->rlen, mask);
	}
	fprintf(out, "\n");
}